

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

void __thiscall TextFile::openMemory(TextFile *this,string *content)

{
  this->fromMemory = true;
  std::__cxx11::string::_M_assign((string *)&this->content);
  this->contentPos = 0;
  this->size_ = content->_M_string_length;
  this->encoding = UTF8;
  this->mode = Read;
  this->lineCount = 0;
  return;
}

Assistant:

void TextFile::openMemory(const std::string& content)
{
	fromMemory = true;
	this->content = content;
	contentPos = 0;
	size_ = (long) content.size();
	encoding = UTF8;
	mode = Read;
	lineCount = 0;
}